

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

uint32_t cfd::core::ConvertToExtkeyVersion
                   (NetType network_type,Bip32FormatType format_type,bool is_privkey)

{
  ExtkeyVersionPair EVar1;
  ExtkeyVersionPair EVar2;
  KeyFormatData format_data;
  KeyFormatData local_90;
  
  GetKeyFormatData(&local_90,network_type);
  EVar2 = KeyFormatData::GetVersionPair(&local_90,format_type);
  EVar1 = (ExtkeyVersionPair)((ulong)EVar2 >> 0x20);
  if (!is_privkey) {
    EVar1 = EVar2;
  }
  KeyFormatData::~KeyFormatData(&local_90);
  return EVar1.pubkey_version;
}

Assistant:

static uint32_t ConvertToExtkeyVersion(
    NetType network_type, Bip32FormatType format_type, bool is_privkey) {
  auto format_data = GetKeyFormatData(network_type);
  auto versions = format_data.GetVersionPair(format_type);
  return (is_privkey) ? versions.privkey_version : versions.pubkey_version;
}